

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O2

string * usb_sysfs_hw_string(string *__return_storage_ptr__,string *sysfs_path)

{
  string vid;
  string pid;
  string serial_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_98,sysfs_path,"/serial");
  read_line(&local_58,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (local_58._M_string_length != 0) {
    format_abi_cxx11_(&local_98,"SNR=%s",local_58._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::operator+(&local_78,sysfs_path,"/idVendor");
  read_line(&local_98,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator+(&local_38,sysfs_path,"/idProduct");
  read_line(&local_78,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  format_abi_cxx11_(__return_storage_ptr__,"USB VID:PID=%s:%s %s",local_98._M_dataplus._M_p,
                    local_78._M_dataplus._M_p,local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string
usb_sysfs_hw_string(const string& sysfs_path)
{
    string serial_number = read_line( sysfs_path + "/serial" );

    if( serial_number.length() > 0 )
    {
        serial_number = format( "SNR=%s", serial_number.c_str() );
    }

    string vid = read_line( sysfs_path + "/idVendor" );

    string pid = read_line( sysfs_path + "/idProduct" );

    return format("USB VID:PID=%s:%s %s", vid.c_str(), pid.c_str(), serial_number.c_str() );
}